

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_Erase::_Run(_Test_Erase *this)

{
  int local_1cc;
  unsigned_long local_1c8;
  Tester local_1c0;
  
  CacheTest::Erase(&this->super_CacheTest,200);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x5c;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1cc = 0;
  local_1c8 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1c0,&local_1cc,&local_1c8);
  test::Tester::~Tester(&local_1c0);
  CacheTest::Insert(&this->super_CacheTest,100,0x65,1);
  CacheTest::Insert(&this->super_CacheTest,200,0xc9,1);
  CacheTest::Erase(&this->super_CacheTest,100);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x61;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8._0_4_ = 0xffffffff;
  local_1cc = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_1c0,(int *)&local_1c8,&local_1cc);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x62;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8 = CONCAT44(local_1c8._4_4_,0xc9);
  local_1cc = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_1c0,(int *)&local_1c8,&local_1cc);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 99;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1cc = 1;
  local_1c8 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1c0,&local_1cc,&local_1c8);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 100;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8._0_4_ = 100;
  test::Tester::IsEq<int,int>
            (&local_1c0,(int *)&local_1c8,
             (this->super_CacheTest).deleted_keys_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x65;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8._0_4_ = 0x65;
  test::Tester::IsEq<int,int>
            (&local_1c0,(int *)&local_1c8,
             (this->super_CacheTest).deleted_values_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start);
  test::Tester::~Tester(&local_1c0);
  CacheTest::Erase(&this->super_CacheTest,100);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x68;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8._0_4_ = 0xffffffff;
  local_1cc = CacheTest::Lookup(&this->super_CacheTest,100);
  test::Tester::IsEq<int,int>(&local_1c0,(int *)&local_1c8,&local_1cc);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x69;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1c8 = CONCAT44(local_1c8._4_4_,0xc9);
  local_1cc = CacheTest::Lookup(&this->super_CacheTest,200);
  test::Tester::IsEq<int,int>(&local_1c0,(int *)&local_1c8,&local_1cc);
  test::Tester::~Tester(&local_1c0);
  local_1c0.ok_ = true;
  local_1c0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache_test.cc"
  ;
  local_1c0.line_ = 0x6a;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c0.ss_);
  local_1cc = 1;
  local_1c8 = (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish -
              (long)(this->super_CacheTest).deleted_keys_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start >> 2;
  test::Tester::IsEq<int,unsigned_long>(&local_1c0,&local_1cc,&local_1c8);
  test::Tester::~Tester(&local_1c0);
  return;
}

Assistant:

TEST(CacheTest, Erase) {
  Erase(200);
  ASSERT_EQ(0, deleted_keys_.size());

  Insert(100, 101);
  Insert(200, 201);
  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
  ASSERT_EQ(100, deleted_keys_[0]);
  ASSERT_EQ(101, deleted_values_[0]);

  Erase(100);
  ASSERT_EQ(-1, Lookup(100));
  ASSERT_EQ(201, Lookup(200));
  ASSERT_EQ(1, deleted_keys_.size());
}